

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Acec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  Gia_Man_t *pGVar6;
  char *pcVar7;
  char *pcVar8;
  Gia_Man_t *pGia0;
  Cec_ParCec_t ParsCec;
  Gia_Man_t *pGia1;
  
  Cec_ManCecSetDefaultParams(&ParsCec);
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
  bVar3 = false;
LAB_0022676d:
  do {
    iVar4 = Extra_UtilGetopt(argc,argv,"CTnmdtvh");
    iVar5 = globalUtilOptind;
    switch(iVar4) {
    case 0x6d:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0022676d;
    case 0x6e:
      ParsCec.fNaive = ParsCec.fNaive ^ 1;
      goto LAB_0022676d;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x75:
      goto switchD_002267af_caseD_6f;
    case 0x74:
      bVar3 = (bool)(bVar3 ^ 1);
      goto LAB_0022676d;
    case 0x76:
      ParsCec.fVerbose = ParsCec.fVerbose ^ 1;
      goto LAB_0022676d;
    }
    if (iVar4 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0022689d:
        Abc_Print(-1,pcVar7);
        goto switchD_002267af_caseD_6f;
      }
      iVar4 = atoi(argv[globalUtilOptind]);
      ParsCec.nBTLimit = iVar4;
    }
    else {
      if (iVar4 != 0x54) {
        if (iVar4 == -1) {
          if (bVar1) {
            pGVar6 = pAbc->pGia;
            if (pGVar6 == (Gia_Man_t *)0x0) {
              pcVar7 = "Abc_CommandAbc9Acec(): There is no AIG.\n";
            }
            else {
              if (bVar2) {
                if ((pGVar6->vCos->nSize - pGVar6->nRegs & 1U) == 0) {
                  if (ParsCec.fSilent == 0) {
                    Abc_Print(1,
                              "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n"
                              ,(ulong)(uint)ParsCec.nBTLimit);
                    pGVar6 = pAbc->pGia;
                  }
                  Gia_ManDemiterDual(pGVar6,&pGia0,&pGia1);
                  goto LAB_00226bb7;
                }
              }
              else {
                if (!bVar3) {
                  if (ParsCec.fSilent == 0) {
                    Abc_Print(1,
                              "Assuming the current network is a single-output miter. (Conflict limit = %d.)\n"
                              ,(ulong)(uint)ParsCec.nBTLimit);
                    pGVar6 = pAbc->pGia;
                  }
                  pGVar6 = Gia_ManDemiterToDual(pGVar6);
                  Gia_ManDemiterDual(pGVar6,&pGia0,&pGia1);
                  Gia_ManStop(pGVar6);
LAB_00226bb7:
                  iVar5 = Gia_PolynCec(pGia0,pGia1,&ParsCec);
                  pAbc->Status = iVar5;
                  Abc_FrameReplaceCex(pAbc,&pGia0->pCexComb);
                  Gia_ManStop(pGia0);
                  Gia_ManStop(pGia1);
                  return 0;
                }
                if ((pGVar6->vCos->nSize - pGVar6->nRegs & 1U) == 0) {
                  if (ParsCec.fSilent == 0) {
                    Abc_Print(1,
                              "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n"
                              ,(ulong)(uint)ParsCec.nBTLimit);
                    pGVar6 = pAbc->pGia;
                  }
                  Gia_ManDemiterTwoWords(pGVar6,&pGia0,&pGia1);
                  goto LAB_00226bb7;
                }
              }
              pcVar7 = "The dual-output miter should have an even number of outputs.\n";
            }
          }
          else {
            if (argc - globalUtilOptind == 1) {
              pcVar7 = argv[globalUtilOptind];
              pcVar8 = pcVar7;
LAB_002269f8:
              do {
                if (*pcVar7 == '>') {
                  *pcVar7 = '\\';
                }
                else if (*pcVar7 == '\0') {
                  __stream = fopen(pcVar8,"r");
                  if (__stream == (FILE *)0x0) {
                    Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar8);
                    pcVar7 = Extra_FileGetSimilarName
                                       (pcVar8,".aig",(char *)0x0,(char *)0x0,(char *)0x0,
                                        (char *)0x0);
                    if (pcVar7 != (char *)0x0) {
                      Abc_Print(1,"Did you mean \"%s\"?",pcVar7);
                    }
                    pcVar7 = "\n";
                    iVar5 = 1;
                    iVar4 = iVar5;
                  }
                  else {
                    fclose(__stream);
                    pGVar6 = Gia_AigerRead(pcVar8,0,0,0);
                    if (pGVar6 != (Gia_Man_t *)0x0) {
                      iVar5 = Gia_PolynCec(pAbc->pGia,pGVar6,&ParsCec);
                      pAbc->Status = iVar5;
                      Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexComb);
                      Gia_ManStop(pGVar6);
                      return 0;
                    }
                    pcVar7 = "Reading AIGER has failed.\n";
                    iVar5 = -1;
                    iVar4 = 0;
                  }
                  Abc_Print(iVar5,pcVar7);
                  return iVar4;
                }
                pcVar7 = pcVar7 + 1;
              } while( true );
            }
            pcVar7 = pAbc->pGia->pSpec;
            pcVar8 = pcVar7;
            if (pcVar7 != (char *)0x0) goto LAB_002269f8;
            pcVar7 = "File name is not given on the command line.\n";
          }
          iVar5 = -1;
          goto LAB_002269a0;
        }
        if (iVar4 != 100) goto switchD_002267af_caseD_6f;
        bVar2 = (bool)(bVar2 ^ 1);
        goto LAB_0022676d;
      }
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0022689d;
      }
      iVar4 = atoi(argv[globalUtilOptind]);
      ParsCec.TimeLimit = iVar4;
    }
    globalUtilOptind = iVar5 + 1;
    if (iVar4 < 0) {
switchD_002267af_caseD_6f:
      iVar5 = -2;
      Abc_Print(-2,"usage: &acec [-CT num] [-nmdtvh]\n");
      Abc_Print(-2,"\t         combinational equivalence checking for arithmetic circuits\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)ParsCec.nBTLimit);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)ParsCec.TimeLimit);
      pcVar8 = "yes";
      pcVar7 = "yes";
      if (ParsCec.fNaive == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-n     : toggle using naive SAT-based checking [default = %s]\n",pcVar7);
      pcVar7 = "miter";
      if (!bVar1) {
        pcVar7 = "two circuits";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (!bVar2) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (!bVar3) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle using two-word miter [default = %s]\n",pcVar7);
      if (ParsCec.fVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar8);
      pcVar7 = "\t-h     : print the command usage\n";
LAB_002269a0:
      Abc_Print(iVar5,pcVar7);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Acec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    Gia_Man_t * pSecond;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int c, nArgcNew, fMiter = 0, fDualOutput = 0, fTwoOutput = 0;
    Cec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTnmdtvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'n':
            pPars->fNaive ^= 1;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'd':
            fDualOutput ^= 1;
            break;
        case 't':
            fTwoOutput ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fMiter )
    {
        Gia_Man_t * pGia0, * pGia1, * pDual;
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Acec(): There is no AIG.\n" );
            return 1;
        }
        if ( fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterDual( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Gia_PolynCec( pGia0, pGia1, pPars );
        }
        else if ( fTwoOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterTwoWords( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Gia_PolynCec( pGia0, pGia1, pPars );
        }
        else
        {
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a single-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            pDual = Gia_ManDemiterToDual( pAbc->pGia );
            Gia_ManDemiterDual( pDual, &pGia0, &pGia1 );
            Gia_ManStop( pDual );
            pAbc->Status = Gia_PolynCec( pGia0, pGia1, pPars );
        }        
        Abc_FrameReplaceCex( pAbc, &pGia0->pCexComb );
        Gia_ManStop( pGia0 );
        Gia_ManStop( pGia1 );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        if ( pAbc->pGia->pSpec == NULL )
        {
            Abc_Print( -1, "File name is not given on the command line.\n" );
            return 1;
        }
        FileName = pAbc->pGia->pSpec;
    }
    else
        FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    pAbc->Status = Gia_PolynCec( pAbc->pGia, pSecond, pPars );
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
    Gia_ManStop( pSecond );
    return 0;

usage:
    Abc_Print( -2, "usage: &acec [-CT num] [-nmdtvh]\n" );
    Abc_Print( -2, "\t         combinational equivalence checking for arithmetic circuits\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-n     : toggle using naive SAT-based checking [default = %s]\n", pPars->fNaive? "yes":"no");
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-t     : toggle using two-word miter [default = %s]\n", fTwoOutput? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}